

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

int32_t __thiscall helics::EndpointInfo::queueSizeUpTo(EndpointInfo *this,Time maxTime)

{
  bool bVar1;
  _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
  *this_00;
  pointer this_01;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *__range1;
  int32_t cnt;
  shared_handle handle;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  _Self local_78;
  _Self local_58;
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *local_38;
  int local_2c;
  shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  local_28;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock_shared((shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_2c = 0;
  local_38 = gmlc::libguarded::
             shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
             ::operator*(&local_28);
  std::
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::begin((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::end((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = std::operator==(&local_58,&local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
               *)std::
                 _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
                 ::operator*(&local_58);
    this_01 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x5cee6c);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&this_01->time,&local_8);
    if (!bVar1) break;
    local_2c = local_2c + 1;
    std::
    _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_const_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
    ::operator++(this_00);
  }
  gmlc::libguarded::
  shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
              *)0x5ceeb1);
  return local_2c;
}

Assistant:

int32_t EndpointInfo::queueSizeUpTo(Time maxTime) const
{
    auto handle = message_queue.lock_shared();
    int32_t cnt = 0;
    for (const auto& msg : *handle) {
        if (msg->time < maxTime) {
            ++cnt;
        } else {
            break;
        }
    }
    return cnt;
}